

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void getFileNameDeletingDirectory(string *path,string *out)

{
  long lVar1;
  string asStack_38 [32];
  
  lVar1 = std::__cxx11::string::rfind((char)path,0x2f);
  if (lVar1 != -2) {
    std::__cxx11::string::substr((ulong)asStack_38,(ulong)path);
    std::__cxx11::string::operator=((string *)out,asStack_38);
    std::__cxx11::string::~string(asStack_38);
    return;
  }
  std::__cxx11::string::_M_assign((string *)out);
  return;
}

Assistant:

void getFileNameDeletingDirectory(const std::string &path, std::string &out)
{
	// パス除去処理
	auto bcPos = path.find_last_of(DIRECTORY_SEPARATOR_CHAR) + 1;
	if (bcPos == std::string::npos) {
		out = path;
	}
	else {
		out = path.substr(bcPos, std::string::npos);
	}
}